

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::write_int_data<char>::write_int_data
          (write_int_data<char> *this,int num_digits,string_view prefix,
          basic_format_specs<char> *specs)

{
  type tVar1;
  ulong uVar2;
  size_t sVar3;
  
  tVar1 = to_unsigned<int>(num_digits);
  this->size = (ulong)tVar1 + prefix.size_;
  this->padding = 0;
  if ((specs->field_0x9 & 0xf) == 4) {
    tVar1 = to_unsigned<int>(specs->width);
    uVar2 = (ulong)tVar1;
    sVar3 = uVar2 - this->size;
    if (this->size <= uVar2 && sVar3 != 0) {
      this->padding = sVar3;
      this->size = uVar2;
    }
  }
  else if (num_digits < specs->precision) {
    tVar1 = to_unsigned<int>(specs->precision);
    this->size = (ulong)tVar1 + prefix.size_;
    tVar1 = to_unsigned<int>(specs->precision - num_digits);
    this->padding = (ulong)tVar1;
  }
  return;
}

Assistant:

write_int_data(int num_digits, string_view prefix,
                 const basic_format_specs<Char>& specs)
      : size(prefix.size() + to_unsigned(num_digits)), padding(0) {
    if (specs.align == align::numeric) {
      auto width = to_unsigned(specs.width);
      if (width > size) {
        padding = width - size;
        size = width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
    }
  }